

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

void cvui::internal::sparkline
               (cvui_block_t *theBlock,vector<double,_std::allocator<double>_> *theValues,int theX,
               int theY,int theWidth,int theHeight,uint theColor)

{
  char *__s;
  Rect aRect;
  double aMax;
  double aMin;
  allocator<char> local_79;
  Rect local_78;
  double local_68;
  double local_60;
  Size local_58;
  String local_50;
  
  local_78.x = theX;
  local_78.y = theY;
  local_78.width = theWidth;
  local_78.height = theHeight;
  if ((ulong)(*(long *)(theValues + 8) - *(long *)theValues) < 9) {
    __s = "Insufficient data points.";
    if (*(long *)(theValues + 8) == *(long *)theValues) {
      __s = "No data.";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_79);
    text(theBlock,theX,theY,&local_50,0.4,0xcecece,false);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    findMinMax(theValues,&local_60,&local_68);
    render::sparkline(theBlock,theValues,&local_78,local_60,local_68,theColor);
  }
  local_58.width = theWidth;
  local_58.height = theHeight;
  updateLayoutFlow(theBlock,&local_58);
  return;
}

Assistant:

void sparkline(cvui_block_t& theBlock, std::vector<double>& theValues, int theX, int theY, int theWidth, int theHeight, unsigned int theColor) {
		double aMin, aMax;
		cv::Rect aRect(theX, theY, theWidth, theHeight);
		std::vector<double>::size_type aHowManyValues = theValues.size();

		if (aHowManyValues >= 2) {
			internal::findMinMax(theValues, &aMin, &aMax);
			render::sparkline(theBlock, theValues, aRect, aMin, aMax, theColor);
		} else {
			internal::text(theBlock, theX, theY, aHowManyValues == 0 ? "No data." : "Insufficient data points.", 0.4, 0xCECECE, false);
		}

		// Update the layout flow
		cv::Size aSize(theWidth, theHeight);
		updateLayoutFlow(theBlock, aSize);
	}